

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge.hpp
# Opt level: O2

string * __thiscall
optimization::mergeBlocks::Merge_Block::pass_name_abi_cxx11_
          (string *__return_storage_ptr__,Merge_Block *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

std::string pass_name() const { return name; }